

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_eh.h
# Opt level: O2

uint64_t resolve_indirect_value(_Unwind_Context *c,uchar encoding,int64_t v,dw_eh_ptr_t start)

{
  long lVar1;
  
  switch((encoding & 0x70) - 0x10 >> 4) {
  case 0:
    v = (int64_t)(start + v);
    goto switchD_00116d1f_default;
  case 1:
    lVar1 = _Unwind_GetTextRelBase();
    break;
  case 2:
    lVar1 = _Unwind_GetDataRelBase();
    break;
  case 3:
    lVar1 = _Unwind_GetRegionStart();
    break;
  default:
    goto switchD_00116d1f_default;
  }
  v = v + lVar1;
switchD_00116d1f_default:
  if ((char)encoding < '\0') {
    v = *(int64_t *)v;
  }
  return (uint64_t)(dw_eh_ptr_t)v;
}

Assistant:

static uint64_t resolve_indirect_value(struct _Unwind_Context *c, unsigned char encoding, int64_t v, dw_eh_ptr_t start)
{
	switch (get_base(encoding))
	{
		case DW_EH_PE_pcrel:
			v += (uint64_t)(uintptr_t)start;
			break;
		case DW_EH_PE_textrel:
			v += (uint64_t)(uintptr_t)_Unwind_GetTextRelBase(c);
			break;
		case DW_EH_PE_datarel:
			v += (uint64_t)(uintptr_t)_Unwind_GetDataRelBase(c);
			break;
		case DW_EH_PE_funcrel:
			v += (uint64_t)(uintptr_t)_Unwind_GetRegionStart(c);
		default:
			break;
	}
	// If this is an indirect value, then it is really the address of the real
	// value
	// TODO: Check whether this should really always be a pointer - it seems to
	// be a GCC extensions, so not properly documented...
	if (is_indirect(encoding))
	{
		v = (uint64_t)(uintptr_t)*(void**)(uintptr_t)v;
	}
	return v;
}